

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlNodePtr xmlTextReaderExpand(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->doc == (xmlDocPtr)0x0) {
    if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      iVar1 = xmlTextReaderDoExpand(reader);
      if (iVar1 < 0) {
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        reader_local = (xmlTextReaderPtr)reader->node;
      }
    }
  }
  else {
    reader_local = (xmlTextReaderPtr)reader->node;
  }
  return (xmlNodePtr)reader_local;
}

Assistant:

xmlNodePtr
xmlTextReaderExpand(xmlTextReaderPtr reader) {
    if ((reader == NULL) || (reader->node == NULL))
        return(NULL);
    if (reader->doc != NULL)
        return(reader->node);
    if (reader->ctxt == NULL)
        return(NULL);
    if (xmlTextReaderDoExpand(reader) < 0)
        return(NULL);
    return(reader->node);
}